

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O2

int raw_find_str(memptr *raw_value,char *str)

{
  char cVar1;
  char cVar2;
  int iVar3;
  __int32_t **pp_Var4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  
  pcVar7 = raw_value->buf;
  cVar1 = pcVar7[raw_value->length];
  lVar6 = 0;
  while (cVar2 = pcVar7[lVar6], (long)cVar2 != 0) {
    pp_Var4 = __ctype_tolower_loc();
    pcVar7[lVar6] = (char)(*pp_Var4)[cVar2];
    lVar6 = lVar6 + 1;
    pcVar7 = raw_value->buf;
  }
  pcVar7[raw_value->length] = '\0';
  pcVar7 = raw_value->buf;
  pcVar5 = strstr(pcVar7,str);
  pcVar7[raw_value->length] = cVar1;
  if (pcVar5 == (char *)0x0) {
    iVar3 = -1;
  }
  else {
    iVar3 = (int)pcVar5 - *(int *)&raw_value->buf;
  }
  return iVar3;
}

Assistant:

int raw_find_str(memptr *raw_value, const char *str)
{
	char c;
	char *ptr;
	int i = 0;

	/* save */
	c = raw_value->buf[raw_value->length];

	/* Make it lowercase */
	for (i = 0; raw_value->buf[i]; ++i) {
		raw_value->buf[i] = (char)tolower(raw_value->buf[i]);
	}

	/* null-terminate */
	raw_value->buf[raw_value->length] = 0;

	/* Find the substring position */
	ptr = strstr(raw_value->buf, str);

	/* restore the "length" byte */
	raw_value->buf[raw_value->length] = c;

	if (ptr == 0) {
		return -1;
	}

	/* return index */
	return (int)(ptr - raw_value->buf);
}